

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::IsUnboundedFunction::checkArguments
          (IsUnboundedFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Expression *pEVar2;
  bool bVar3;
  long lVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  lVar4 = 400;
  if ((bVar3) &&
     ((pEVar2 = *args->_M_ptr, (pEVar2->kind & ~IntegerLiteral) != NamedValue ||
      (lVar4 = 0x148, **(int **)(pEVar2 + 1) != 0x27)))) {
    ASTContext::addDiag(context,(DiagCode)0x2e000b,pEVar2->sourceRange);
    lVar4 = 0x148;
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar4);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!ValueExpressionBase::isKind(args[0]->kind) ||
            args[0]->as<ValueExpressionBase>().symbol.kind != SymbolKind::Parameter) {
            context.addDiag(diag::IsUnboundedParamArg, args[0]->sourceRange);
        }

        return comp.getBitType();
    }